

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[10],int,char[17],unsigned_long,char[3],unsigned_long,char[3]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [10],
                   int *args_1,char (*args_2) [17],unsigned_long *args_3,char (*args_4) [3],
                   unsigned_long *args_5,char (*args_6) [3])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_228;
  cmAlphaNum local_1f8;
  cmAlphaNum local_1c8;
  cmAlphaNum local_198;
  cmAlphaNum local_168;
  cmAlphaNum local_138;
  cmAlphaNum local_108;
  string_view local_d8;
  string_view local_c8;
  string_view local_b8;
  string_view local_a8;
  string_view local_98;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58;
  iterator local_48;
  undefined8 local_40;
  char (*local_38) [17];
  char (*args_local_2) [17];
  int *args_local_1;
  char (*args_local) [10];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_38 = args_2;
  args_local_2 = (char (*) [17])args_1;
  args_local_1 = (int *)args;
  args_local = (char (*) [10])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_d8 = cmAlphaNum::View(a);
  local_c8 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_108,(char *)args_local_1);
  local_b8 = cmAlphaNum::View(&local_108);
  cmAlphaNum::cmAlphaNum(&local_138,*(int *)*args_local_2);
  local_a8 = cmAlphaNum::View(&local_138);
  cmAlphaNum::cmAlphaNum(&local_168,*local_38);
  local_98 = cmAlphaNum::View(&local_168);
  cmAlphaNum::cmAlphaNum(&local_198,*args_3);
  local_88 = cmAlphaNum::View(&local_198);
  cmAlphaNum::cmAlphaNum(&local_1c8,*args_4);
  local_78 = cmAlphaNum::View(&local_1c8);
  cmAlphaNum::cmAlphaNum(&local_1f8,*args_5);
  local_68 = cmAlphaNum::View(&local_1f8);
  cmAlphaNum::cmAlphaNum(&local_228,*args_6);
  local_58 = cmAlphaNum::View(&local_228);
  local_48 = &local_d8;
  local_40 = 9;
  views._M_len = 9;
  views._M_array = local_48;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}